

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

RandomUniformStaticLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_randomuniformstatic(NeuralNetworkLayer *this)

{
  bool bVar1;
  RandomUniformStaticLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_randomuniformstatic(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_randomuniformstatic(this);
    this_00 = (RandomUniformStaticLayerParams *)operator_new(0x40);
    RandomUniformStaticLayerParams::RandomUniformStaticLayerParams(this_00);
    (this->layer_).randomuniformstatic_ = this_00;
  }
  return (RandomUniformStaticLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::RandomUniformStaticLayerParams* NeuralNetworkLayer::mutable_randomuniformstatic() {
  if (!has_randomuniformstatic()) {
    clear_layer();
    set_has_randomuniformstatic();
    layer_.randomuniformstatic_ = new ::CoreML::Specification::RandomUniformStaticLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.randomUniformStatic)
  return layer_.randomuniformstatic_;
}